

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_decomposition.hpp
# Opt level: O2

void __thiscall
polar::
polar_decomposition<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (polar *this,
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *A,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *U,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *H,double rtol,size_t max_iter)

{
  bool bVar1;
  bool bVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar3;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar4;
  result_type rVar5;
  result_type rVar6;
  result_type rVar7;
  result_type rVar8;
  double dVar9;
  double dVar10;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_c0;
  value_type gamma;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_b0;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_a8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_a0;
  polar *local_98;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_90;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_88;
  polar *local_80;
  double local_78;
  double local_70;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_68;
  double local_60;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  X;
  
  local_70 = rtol;
  local_68 = H;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(A,*(size_type *)this,*(size_type *)(this + 8),true);
  boost::numeric::ublas::
  indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            (A,this);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(U,*(size_type *)this,*(size_type *)(this + 8),true);
  local_80 = this;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&X,*(size_type *)this,*(size_type *)(this + 8));
  pmVar4 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)0x0;
  local_88 = A;
  bVar1 = false;
  while( true ) {
    boost::numeric::ublas::
    indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              (&X,A);
    detail::
    invert<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              (&X,U);
    gamma = 1.0;
    if (!bVar1) {
      local_b0 = &X;
      rVar5 = boost::numeric::ublas::
              matrix_norm_1<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              ::
              apply<boost::numeric::ublas::matrix_reference<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>>
                        ((matrix_expression<boost::numeric::ublas::matrix_reference<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                          *)&local_b0);
      local_c0 = &X;
      rVar6 = boost::numeric::ublas::
              matrix_norm_inf<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              ::
              apply<boost::numeric::ublas::matrix_reference<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>>
                        ((matrix_expression<boost::numeric::ublas::matrix_reference<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                          *)&local_c0);
      dVar9 = rVar5 * rVar6;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      local_b0 = U;
      local_78 = boost::numeric::ublas::
                 matrix_norm_1<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                 ::
                 apply<boost::numeric::ublas::matrix_reference<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>>
                           ((matrix_expression<boost::numeric::ublas::matrix_reference<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                             *)&local_b0);
      local_c0 = U;
      rVar6 = boost::numeric::ublas::
              matrix_norm_inf<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              ::
              apply<boost::numeric::ublas::matrix_reference<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>>
                        ((matrix_expression<boost::numeric::ublas::matrix_reference<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                          *)&local_c0);
      dVar10 = local_78 * rVar6;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar10 = dVar10 / dVar9;
      if (dVar10 < 0.0) {
        gamma = sqrt(dVar10);
      }
      else {
        gamma = SQRT(dVar10);
      }
    }
    pmVar3 = local_88;
    local_c0 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)0x3fe0000000000000;
    local_60 = 1.0 / gamma;
    local_b0 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)&local_c0;
    local_a8 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)&gamma;
    local_98 = (polar *)&local_60;
    local_a0 = &X;
    local_90 = U;
    boost::numeric::ublas::
    indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
              (local_88,(matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                         *)&local_b0);
    local_a8 = pmVar3;
    local_b0 = &X;
    rVar7 = boost::numeric::ublas::
            matrix_norm_1<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
            ::
            apply<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                      ((matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                        *)&local_b0);
    local_c0 = &X;
    rVar5 = boost::numeric::ublas::
            matrix_norm_1<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            ::
            apply<boost::numeric::ublas::matrix_reference<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>>
                      ((matrix_expression<boost::numeric::ublas::matrix_reference<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                        *)&local_c0);
    A = local_88;
    if ((rVar7 < rVar5 * local_70) ||
       ((local_68 !=
         (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)0x0 &&
        (pmVar4 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)((long)&pmVar4->size1_ + 1), pmVar4 == local_68)))) break;
    bVar2 = !bVar1;
    bVar1 = true;
    if (bVar2) {
      local_a8 = local_88;
      local_b0 = &X;
      rVar8 = boost::numeric::ublas::
              matrix_norm_frobenius<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
              ::
              apply<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                        ((matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                          *)&local_b0);
      if (0.01 <= rVar8) {
        bVar1 = false;
      }
    }
  }
  gamma = 0.5;
  local_b0 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)&gamma;
  local_a8 = local_88;
  local_a0 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)local_80;
  local_98 = local_80;
  local_90 = local_88;
  boost::numeric::ublas::
  indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<d___umeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
            (U);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&X.data_);
  return;
}

Assistant:

void polar_decomposition(Matrix_in const& A, Matrix_out& U, Matrix_out& H,
        double rtol = 1.0e-8, std::size_t max_iter = 0)
{
    typedef typename Matrix_out::value_type value_type;

    BOOST_ASSERT(A.size1() == A.size2());

    U.resize(A.size1(), A.size2());
    U.assign(A);
    H.resize(A.size1(), A.size2());
    Matrix_out X(A.size1(), A.size2());

    std::size_t count = 0;
    bool close_to_convergence = false;

    while (true)
    {
        X.assign(U);
        detail::invert(X, H);
        value_type gamma = 1.0;

        if (!close_to_convergence)
        {
            value_type alpha = std::sqrt(norm_1(X) * norm_inf(X));
            value_type beta  = std::sqrt(norm_1(H) * norm_inf(H));
            gamma = std::sqrt(beta / alpha);
        }

        U.assign(0.5 * (gamma * X + 1.0 / gamma * trans(H)));

        if (norm_1(X - U) < rtol * norm_1(X))
            break;

        if (max_iter != 0 && ++count == max_iter)
            break;

        if (!close_to_convergence && norm_frobenius(X - U) < 1.0e-2)
            close_to_convergence = true;
    }

    H.assign(0.5 * (prod(trans(U), A) + prod(trans(A), U)));
}